

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict post_expr(c2m_ctx_t c2m_ctx,int no_err_p)

{
  short sVar1;
  parse_ctx *ppVar2;
  token_t ptVar3;
  node_t_conflict pnVar4;
  node_t_conflict pnVar5;
  node_t_conflict pnVar6;
  node_t_conflict op2;
  char *expected_name;
  int token_code;
  c2m_ctx_t c2m_ctx_00;
  pos_t pVar7;
  
  ppVar2 = c2m_ctx->parse_ctx;
  ptVar3 = ppVar2->curr_token;
  sVar1 = *(short *)ptVar3;
  switch(sVar1) {
  case 0x100:
  case 0x101:
  case 0x102:
  case 0x103:
    pnVar4 = ptVar3->node;
    c2m_ctx_00 = (c2m_ctx_t)c2m_ctx->recorded_tokens;
    break;
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x107:
  case 0x108:
  case 0x109:
    goto switchD_00196f53_caseD_104;
  case 0x10a:
    pVar7 = ptVar3->pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    ptVar3 = c2m_ctx->parse_ctx->curr_token;
    if (*(short *)ptVar3 != 0x103) {
      if (ppVar2->record_level != 0) goto switchD_00196f53_caseD_104;
      expected_name = "identifier";
LAB_001972d1:
      syntax_error(c2m_ctx,expected_name);
      goto switchD_00196f53_caseD_104;
    }
    pnVar4 = ptVar3->node;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    pnVar4 = new_pos_node1(c2m_ctx,N_LABEL_ADDR,pVar7,pnVar4);
    goto LAB_00196f68;
  default:
    if (sVar1 != 0x28) {
      if (sVar1 != 0x115) goto switchD_00196f53_caseD_104;
      pVar7 = ptVar3->pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x28) {
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        pnVar4 = right_op(c2m_ctx,no_err_p,0x104,0x3d,cond_expr,assign_expr);
        if (pnVar4 == &err_struct) goto switchD_00196f53_caseD_104;
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x2c) {
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
          pnVar5 = new_node(c2m_ctx,N_LIST);
          pnVar4 = new_node2(c2m_ctx,N_GENERIC,pnVar4,pnVar5);
          add_pos(c2m_ctx,pnVar4,pVar7);
          while( true ) {
            ptVar3 = c2m_ctx->parse_ctx->curr_token;
            if (*(short *)ptVar3 == 0x120) {
              pVar7 = ptVar3->pos;
              read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
              pnVar6 = new_node(c2m_ctx,N_IGNORE);
            }
            else {
              pnVar6 = type_name(c2m_ctx,no_err_p);
              if (pnVar6 == &err_struct) goto switchD_00196f53_caseD_104;
              pVar7 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                   (node_t_conflict)(ulong)pnVar6->uid);
            }
            if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x3a) {
              if (ppVar2->record_level != 0) goto switchD_00196f53_caseD_104;
              token_code = 0x3a;
              goto LAB_001972c6;
            }
            read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
            op2 = right_op(c2m_ctx,no_err_p,0x104,0x3d,cond_expr,assign_expr);
            if (op2 == &err_struct) goto switchD_00196f53_caseD_104;
            pnVar6 = new_node2(c2m_ctx,N_GENERIC_ASSOC,pnVar6,op2);
            add_pos(c2m_ctx,pnVar6,pVar7);
            op_append(c2m_ctx,pnVar5,pnVar6);
            sVar1 = *(short *)c2m_ctx->parse_ctx->curr_token;
            if (sVar1 != 0x2c) break;
            read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
          }
          if (sVar1 == 0x29) goto LAB_0019729c;
          if (ppVar2->record_level != 0) goto switchD_00196f53_caseD_104;
          token_code = 0x29;
        }
        else {
          if (ppVar2->record_level != 0) goto switchD_00196f53_caseD_104;
          token_code = 0x2c;
        }
      }
      else {
        if (ppVar2->record_level != 0) goto switchD_00196f53_caseD_104;
        token_code = 0x28;
      }
LAB_001972c6:
      expected_name = get_token_name(c2m_ctx,token_code);
      goto LAB_001972d1;
    }
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    if (*(short *)ppVar2->curr_token == 0x7b) {
      pnVar5 = compound_stmt(c2m_ctx,no_err_p);
      if (pnVar5 == &err_struct) goto switchD_00196f53_caseD_104;
      pnVar4 = new_node(c2m_ctx,N_STMTEXPR);
      op_append(c2m_ctx,pnVar4,pnVar5);
    }
    else {
      pnVar4 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
      if (pnVar4 == &err_struct) goto switchD_00196f53_caseD_104;
    }
    if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x29) goto switchD_00196f53_caseD_104;
LAB_0019729c:
    c2m_ctx_00 = (c2m_ctx_t)c2m_ctx->recorded_tokens;
  }
  read_token(c2m_ctx_00);
LAB_00196f68:
  if (pnVar4 != &err_struct) {
    pnVar4 = post_expr_part(c2m_ctx,no_err_p,pnVar4);
    return pnVar4;
  }
switchD_00196f53_caseD_104:
  return &err_struct;
}

Assistant:

D (post_expr) {
  node_t r;

  P (primary_expr);
  PA (post_expr_part, r);
  return r;
}